

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::EntryPointInfo::PinTypeRefs(EntryPointInfo *this,ScriptContext *scriptContext)

{
  JitTransferData *pJVar1;
  PinnedTypeRefsIDL *pPVar2;
  code *pcVar3;
  bool bVar4;
  NativeEntryPointData *this_00;
  undefined4 *puVar5;
  
  this_00 = GetNativeEntryPointData(this);
  pJVar1 = (this_00->jitTransferData).ptr;
  if ((pJVar1 == (JitTransferData *)0x0) || (pJVar1->isReady == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x20cc,
                                "(jitTransferData != nullptr && jitTransferData->GetIsReady())",
                                "jitTransferData != nullptr && jitTransferData->GetIsReady()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pPVar2 = (pJVar1->runtimeTypeRefs).ptr;
  if (pPVar2 != (PinnedTypeRefsIDL *)0x0) {
    NativeEntryPointData::PinTypeRefs
              (this_00,scriptContext->recycler,(long)(int)pPVar2->count,(void **)(pPVar2 + 1));
    return;
  }
  return;
}

Assistant:

void EntryPointInfo::PinTypeRefs(ScriptContext* scriptContext)
    {
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        JitTransferData * jitTransferData = nativeEntryPointData->GetJitTransferData();
        Assert(jitTransferData != nullptr && jitTransferData->GetIsReady());

        Recycler* recycler = scriptContext->GetRecycler();
        if (jitTransferData->GetRuntimeTypeRefs() != nullptr)
        {
            // Copy pinned types from a heap allocated array created on the background thread
            // to a recycler allocated array which will live as long as this EntryPointInfo.
            // The original heap allocated array will be freed at the end of NativeCodeGenerator::CheckCodeGenDone
            void** jitPinnedTypeRefs = jitTransferData->GetRuntimeTypeRefs();
            size_t jitPinnedTypeRefCount = jitTransferData->GetRuntimeTypeRefCount();
            nativeEntryPointData->PinTypeRefs(recycler, jitPinnedTypeRefCount, jitPinnedTypeRefs);
        }
    }